

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scenario.cpp
# Opt level: O0

string * __thiscall
multi_agent_planning::Interaction::toString_abi_cxx11_
          (string *__return_storage_ptr__,Interaction *this)

{
  basic_ostream<char,_std::char_traits<char>_> *pbVar1;
  ostream *poVar2;
  stringstream local_1a0 [8];
  stringstream ss;
  undefined1 local_190 [376];
  Interaction *local_18;
  Interaction *this_local;
  
  local_18 = this;
  this_local = (Interaction *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  pbVar1 = (basic_ostream<char,_std::char_traits<char>_> *)
           std::ostream::operator<<(local_190,this->agentA);
  pbVar1 = std::operator<<(pbVar1,&this->actionA);
  poVar2 = std::operator<<(pbVar1," -> ");
  pbVar1 = (basic_ostream<char,_std::char_traits<char>_> *)
           std::ostream::operator<<(poVar2,this->agentB);
  pbVar1 = std::operator<<(pbVar1,&this->actionB);
  poVar2 = std::operator<<(pbVar1,": ");
  std::ostream::operator<<(poVar2,this->cost);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

string Interaction::toString() const {
	stringstream ss;
	ss << agentA << actionA << " -> " << agentB << actionB << ": " << cost;
	return ss.str();
}